

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdLib.cpp
# Opt level: O1

void __thiscall ObjectBlockPool<16,_4096>::~ObjectBlockPool(ObjectBlockPool<16,_4096> *this)

{
  Reset(this);
  if ((this->objectsToFree).data != (SmallBlock<16> **)0x0) {
    (*(code *)NULLC::dealloc)();
  }
  if ((this->objectsToFinalize).data != (SmallBlock<16> **)0x0) {
    (*(code *)NULLC::dealloc)();
  }
  if ((this->sortedPages).data != (LargeBlock<16,_4096> **)0x0) {
    (*(code *)NULLC::dealloc)();
  }
  return;
}

Assistant:

~ObjectBlockPool()
	{
		Reset();
	}